

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O0

int compressor_segment_mix(mixed_segment *segment)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float premixgaindb;
  float gain;
  float premixgain;
  float dbpersample;
  float attenuationdb;
  float rate;
  float inputcomp;
  float attenuation;
  float inputL;
  int chi;
  float attenuate;
  float releasesamples;
  float x;
  float enveloperate;
  float compdiffdb;
  float scaleddesiredgain;
  float desiredgain;
  int ch;
  int chunks;
  float *output;
  float *input;
  uint32_t samples;
  float spacingdb;
  int samplepos;
  float ang90inv;
  float ang90;
  int samplesperchunk;
  float *delaybuf;
  int local_78;
  int delayreadpos;
  int delaywritepos;
  int delaybufsize;
  float maxcompdiffdb;
  float compgain;
  float detectoravg;
  float d;
  float c;
  float b;
  float a;
  float mastergain;
  float linearthresholdknee;
  float kneedboffset;
  float k;
  float dry;
  float wet;
  float satreleasesamplesinv;
  float attacksamplesinv;
  float slope;
  float linearthreshold;
  float linearpregain;
  float knee;
  float threshold;
  float meterrelease;
  float metergain;
  compressor_segment_data *data;
  mixed_segment *segment_local;
  
  _meterrelease = (undefined8 *)segment->data;
  threshold = *(float *)(_meterrelease + 2);
  knee = *(float *)((long)_meterrelease + 0x14);
  linearpregain = *(float *)(_meterrelease + 3);
  linearthreshold = *(float *)((long)_meterrelease + 0x1c);
  slope = *(float *)(_meterrelease + 4);
  attacksamplesinv = *(float *)((long)_meterrelease + 0x24);
  satreleasesamplesinv = *(float *)(_meterrelease + 5);
  wet = *(float *)((long)_meterrelease + 0x2c);
  dry = *(float *)(_meterrelease + 6);
  k = *(float *)((long)_meterrelease + 0x34);
  kneedboffset = *(float *)(_meterrelease + 7);
  linearthresholdknee = *(float *)((long)_meterrelease + 0x3c);
  mastergain = *(float *)(_meterrelease + 8);
  a = *(float *)((long)_meterrelease + 0x44);
  b = *(float *)(_meterrelease + 9);
  c = *(float *)((long)_meterrelease + 0x4c);
  d = *(float *)(_meterrelease + 10);
  detectoravg = *(float *)((long)_meterrelease + 0x54);
  compgain = *(float *)(_meterrelease + 0xb);
  maxcompdiffdb = *(float *)((long)_meterrelease + 0x5c);
  delaybufsize = *(int *)(_meterrelease + 0xc);
  delaywritepos = *(int *)((long)_meterrelease + 100);
  delayreadpos = *(int *)(_meterrelease + 0xd);
  local_78 = *(int *)((long)_meterrelease + 0x6c);
  delaybuf._4_4_ = *(int *)(_meterrelease + 0xe);
  _ang90 = (long)_meterrelease + 0x74;
  ang90inv = 4.48416e-44;
  samplepos = 0x3fc90fdb;
  spacingdb = 0.63661975;
  samples = 0;
  input._4_4_ = 5.0;
  input._0_4_ = 0xffffffff;
  data = (compressor_segment_data *)segment;
  mixed_buffer_request_read(&output,(uint32_t *)&input,(mixed_buffer *)*_meterrelease);
  mixed_buffer_request_write((float **)&ch,(uint32_t *)&input,(mixed_buffer *)_meterrelease[1]);
  uVar1 = (uint32_t)input / (uint)ang90inv;
  input._0_4_ = uVar1 * (int)ang90inv;
  for (scaleddesiredgain = 0.0; (int)scaleddesiredgain < (int)uVar1;
      scaleddesiredgain = (float)((int)scaleddesiredgain + 1)) {
    maxcompdiffdb = fixf(maxcompdiffdb,1.0);
    fVar2 = asinf(maxcompdiffdb);
    fVar2 = fVar2 * spacingdb;
    fVar3 = lin2db((float)delaybufsize / fVar2);
    if (0.0 <= fVar3) {
      fVar3 = fixf(fVar3,1.0);
      if ((((float)delaywritepos == -1.0) && (!NAN((float)delaywritepos))) ||
         ((float)delaywritepos < fVar3)) {
        delaywritepos = (int)fVar3;
      }
      inputL = (float)delaywritepos;
      if ((float)delaywritepos < 0.5) {
        inputL = 0.5;
      }
      fVar3 = powf(0.25 / inputL,wet);
      releasesamples = 1.0 - fVar3;
    }
    else {
      fVar3 = fixf(fVar3,-1.0);
      delaywritepos = -0x40800000;
      fVar3 = clampf(fVar3,-12.0,0.0);
      fVar3 = adaptivereleasecurve((fVar3 + 12.0) * 0.25,c,d,detectoravg,compgain);
      releasesamples = db2lin(input._4_4_ / fVar3);
    }
    for (attenuation = 0.0; (int)attenuation < (int)ang90inv;
        attenuation = (float)((int)attenuation + 1)) {
      fVar3 = output[(int)samples];
      *(float *)(_ang90 + (long)local_78 * 4) = fVar3 * slope;
      fVar3 = absf(fVar3 * slope);
      if (0.0001 <= fVar3) {
        fVar4 = compcurve(fVar3,linearthresholdknee,satreleasesamplesinv,attacksamplesinv,a,
                          linearpregain,linearthreshold,mastergain);
        rate = fVar4 / fVar3;
      }
      else {
        rate = 1.0;
      }
      if (rate <= maxcompdiffdb) {
        dbpersample = 1.0;
      }
      else {
        fVar3 = lin2db(rate);
        premixgain = -fVar3;
        if (premixgain < 2.0) {
          premixgain = 2.0;
        }
        fVar3 = db2lin(premixgain * dry);
        dbpersample = fVar3 - 1.0;
      }
      maxcompdiffdb = (rate - maxcompdiffdb) * dbpersample + maxcompdiffdb;
      if (1.0 < maxcompdiffdb) {
        maxcompdiffdb = 1.0;
      }
      maxcompdiffdb = fixf(maxcompdiffdb,1.0);
      if (1.0 <= releasesamples) {
        delaybufsize = (int)(releasesamples * (float)delaybufsize);
        if (1.0 < (float)delaybufsize) {
          delaybufsize = 0x3f800000;
        }
      }
      else {
        delaybufsize = (int)((fVar2 - (float)delaybufsize) * releasesamples + (float)delaybufsize);
      }
      fVar3 = sinf((float)samplepos * (float)delaybufsize);
      fVar4 = k * b * fVar3 + kneedboffset;
      fVar3 = lin2db(fVar3);
      if (threshold <= fVar3) {
        fVar3 = (fVar3 - threshold) * knee + threshold;
      }
      threshold = fVar3;
      _ch[(int)samples] = *(float *)(_ang90 + (long)delaybuf._4_4_ * 4) * fVar4;
      samples = samples + 1;
      delaybuf._4_4_ = (delaybuf._4_4_ + 1) % delayreadpos;
      local_78 = (local_78 + 1) % delayreadpos;
    }
  }
  mixed_buffer_finish_write((uint32_t)input,(mixed_buffer *)_meterrelease[1]);
  mixed_buffer_finish_read((uint32_t)input,(mixed_buffer *)*_meterrelease);
  *(float *)(_meterrelease + 2) = threshold;
  *(float *)((long)_meterrelease + 0x5c) = maxcompdiffdb;
  *(int *)(_meterrelease + 0xc) = delaybufsize;
  *(int *)((long)_meterrelease + 100) = delaywritepos;
  *(int *)((long)_meterrelease + 0x6c) = local_78;
  *(int *)(_meterrelease + 0xe) = delaybuf._4_4_;
  return 1;
}

Assistant:

VECTORIZE int compressor_segment_mix(struct mixed_segment *segment){
  struct compressor_segment_data *data = (struct compressor_segment_data *)segment->data;

  float metergain            = data->metergain;
  float meterrelease         = data->meterrelease;
  float threshold            = data->threshold;
  float knee                 = data->knee;
  float linearpregain        = data->linearpregain;
  float linearthreshold      = data->linearthreshold;
  float slope                = data->slope;
  float attacksamplesinv     = data->attacksamplesinv;
  float satreleasesamplesinv = data->satreleasesamplesinv;
  float wet                  = data->wet;
  float dry                  = data->dry;
  float k                    = data->k;
  float kneedboffset         = data->kneedboffset;
  float linearthresholdknee  = data->linearthresholdknee;
  float mastergain           = data->mastergain;
  float a                    = data->a;
  float b                    = data->b;
  float c                    = data->c;
  float d                    = data->d;
  float detectoravg          = data->detectoravg;
  float compgain             = data->compgain;
  float maxcompdiffdb        = data->maxcompdiffdb;
  int delaybufsize           = data->delaybufsize;
  int delaywritepos          = data->delaywritepos;
  int delayreadpos           = data->delayreadpos;
  float *delaybuf            = data->delaybuf;

  int samplesperchunk = MIXED_COMPRESSOR_SAMPLES_PER_UPDATE;
  float ang90 = (float)M_PI * 0.5f;
  float ang90inv = 2.0f / (float)M_PI;
  int samplepos = 0;
  float spacingdb = MIXED_COMPRESSOR_SPACING;

  uint32_t samples = UINT32_MAX;
  float *input, *output;
  mixed_buffer_request_read(&input, &samples, data->in);
  mixed_buffer_request_write(&output, &samples, data->out);
  
  int chunks = samples / samplesperchunk;
  samples = chunks * samplesperchunk;

  for (int ch = 0; ch < chunks; ch++){
    detectoravg = fixf(detectoravg, 1.0f);
    float desiredgain = detectoravg;
    float scaleddesiredgain = asinf(desiredgain) * ang90inv;
    float compdiffdb = lin2db(compgain / scaleddesiredgain);

    // calculate envelope rate based on whether we're attacking or releasing
    float enveloperate;
    if (compdiffdb < 0.0f){ // compgain < scaleddesiredgain, so we're releasing
      compdiffdb = fixf(compdiffdb, -1.0f);
      maxcompdiffdb = -1; // reset for a future attack mode
      // apply the adaptive release curve
      // scale compdiffdb between 0-3
      float x = (clampf(compdiffdb, -12.0f, 0.0f) + 12.0f) * 0.25f;
      float releasesamples = adaptivereleasecurve(x, a, b, c, d);
      enveloperate = db2lin(spacingdb / releasesamples);
    }
    else{ // compresorgain > scaleddesiredgain, so we're attacking
      compdiffdb = fixf(compdiffdb, 1.0f);
      if (maxcompdiffdb == -1 || maxcompdiffdb < compdiffdb)
        maxcompdiffdb = compdiffdb;
      float attenuate = maxcompdiffdb;
      if (attenuate < 0.5f)
        attenuate = 0.5f;
      enveloperate = 1.0f - powf(0.25f / attenuate, attacksamplesinv);
    }

    // process the chunk
    for (int chi = 0; chi < samplesperchunk; chi++, samplepos++,
           delayreadpos = (delayreadpos + 1) % delaybufsize,
           delaywritepos = (delaywritepos + 1) % delaybufsize){

      float inputL = input[samplepos] * linearpregain;
      delaybuf[delaywritepos] = inputL;

      inputL = absf(inputL);

      float attenuation;
      if (inputL < 0.0001f)
        attenuation = 1.0f;
      else{
        float inputcomp = compcurve(inputL, k, slope, linearthreshold, linearthresholdknee, threshold, knee, kneedboffset);
        attenuation = inputcomp / inputL;
      }

      float rate;
      if (attenuation > detectoravg){ // if releasing
        float attenuationdb = -lin2db(attenuation);
        if (attenuationdb < 2.0f)
          attenuationdb = 2.0f;
        float dbpersample = attenuationdb * satreleasesamplesinv;
        rate = db2lin(dbpersample) - 1.0f;
      }
      else
        rate = 1.0f;

      detectoravg += (attenuation - detectoravg) * rate;
      if (detectoravg > 1.0f)
        detectoravg = 1.0f;
      detectoravg = fixf(detectoravg, 1.0f);

      if (enveloperate < 1) // attack, reduce gain
        compgain += (scaleddesiredgain - compgain) * enveloperate;
      else{ // release, increase gain
        compgain *= enveloperate;
        if (compgain > 1.0f)
          compgain = 1.0f;
      }

      // the final gain value!
      float premixgain = sinf(ang90 * compgain);
      float gain = dry + wet * mastergain * premixgain;

      // calculate metering (not used in core algo, but used to output a meter if desired)
      float premixgaindb = lin2db(premixgain);
      if (premixgaindb < metergain)
        metergain = premixgaindb; // spike immediately
      else
        metergain += (premixgaindb - metergain) * meterrelease; // fall slowly

      // apply the gain
      output[samplepos] = delaybuf[delayreadpos] * gain;
    }
  }

  mixed_buffer_finish_write(samples, data->out);
  mixed_buffer_finish_read(samples, data->in);

  data->metergain     = metergain;
  data->detectoravg   = detectoravg;
  data->compgain      = compgain;
  data->maxcompdiffdb = maxcompdiffdb;
  data->delaywritepos = delaywritepos;
  data->delayreadpos  = delayreadpos;
  
  return 1;
}